

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  size_t __n;
  int dim;
  uint pos;
  ulong uVar4;
  
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>
  ::Base_swap((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>
               *)this,(uint)(((long)(orderedBoundaries->
                                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(orderedBoundaries->
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x18));
  *(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
    **)(this + 0x78) = this + 0xa8;
  *(undefined8 *)(this + 0x80) = 1;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined4 *)(this + 0x98) = 0x3f800000;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  __n = ((long)(orderedBoundaries->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(orderedBoundaries->
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  *(int *)(this + 0xb0) = (int)__n;
  *(Column_settings **)(this + 0xb8) = colSettings;
  std::__detail::
  _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)(this + 0x78),__n);
  pos = 0;
  while( true ) {
    uVar4 = (ulong)pos;
    pvVar1 = (orderedBoundaries->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(orderedBoundaries->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar4)
    break;
    puVar2 = *(pointer *)
              ((long)&pvVar1[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    puVar3 = pvVar1[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dim = (int)((ulong)((long)puVar2 - (long)puVar3) >> 2) + -1;
    if (puVar2 == puVar3) {
      dim = 0;
    }
    _container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (this,pvVar1 + uVar4,pos,dim);
    pos = pos + 1;
  }
  return;
}

Assistant:

inline Boundary_matrix<Master_matrix>::Boundary_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                                       Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Swap_opt(orderedBoundaries.size()),
      Pair_opt(),
      RA_opt(orderedBoundaries.size()),
      nextInsertIndex_(orderedBoundaries.size()),
      colSettings_(colSettings)
{
  matrix_.reserve(orderedBoundaries.size());

  for (Index i = 0; i < orderedBoundaries.size(); i++) {
    _container_insert(orderedBoundaries[i], i, orderedBoundaries[i].size() == 0 ? 0 : orderedBoundaries[i].size() - 1);
  }
}